

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::DisplayOutputs(cmCursesMainForm *this,string *newOutput)

{
  cmCursesLongMessageForm *pcVar1;
  cmCursesLongMessageForm *this_00;
  int iVar2;
  int iVar3;
  
  iVar2 = -1;
  iVar3 = -1;
  if (_stdscr != 0) {
    iVar3 = *(short *)(_stdscr + 4) + 1;
    iVar2 = *(short *)(_stdscr + 6) + 1;
  }
  pcVar1 = (this->LogForm)._M_t.
           super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>
           .super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl;
  if ((cmCursesLongMessageForm *)cmCursesForm::CurrentForm == pcVar1) {
    cmCursesLongMessageForm::UpdateContent(pcVar1,newOutput,&this->LastProgress);
    return;
  }
  this_00 = (cmCursesLongMessageForm *)operator_new(0x68);
  cmCursesLongMessageForm::cmCursesLongMessageForm
            (this_00,&this->Outputs,(this->LastProgress)._M_dataplus._M_p,ScrollDown);
  pcVar1 = (this->LogForm)._M_t.
           super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>
           .super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl;
  cmCursesForm::CurrentForm = (cmCursesForm *)this_00;
  (this->LogForm)._M_t.
  super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>._M_t
  .super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>.
  super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl = this_00;
  if (pcVar1 != (cmCursesLongMessageForm *)0x0) {
    (**(code **)((long)(pcVar1->super_cmCursesForm)._vptr_cmCursesForm + 8))();
  }
  pcVar1 = (this->LogForm)._M_t.
           super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>
           .super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl;
  (**(code **)((long)(pcVar1->super_cmCursesForm)._vptr_cmCursesForm + 0x18))
            (pcVar1,1,1,iVar2,iVar3);
  return;
}

Assistant:

void cmCursesMainForm::DisplayOutputs(std::string const& newOutput)
{
  int xi;
  int yi;
  getmaxyx(stdscr, yi, xi);

  if (CurrentForm != this->LogForm.get()) {
    auto* newLogForm = new cmCursesLongMessageForm(
      this->Outputs, this->LastProgress.c_str(),
      cmCursesLongMessageForm::ScrollBehavior::ScrollDown);
    CurrentForm = newLogForm;
    this->LogForm.reset(newLogForm);
    this->LogForm->Render(1, 1, xi, yi);
  } else {
    this->LogForm->UpdateContent(newOutput, this->LastProgress);
  }
}